

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_utils.cc
# Opt level: O1

timespec convert_reltime_to_abstime(uint ms)

{
  ulong uVar1;
  timespec tVar2;
  timeval tp;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  uVar1 = (ulong)ms + local_20.tv_sec * 1000 + local_20.tv_usec / 1000 +
          (ulong)(499 < local_20.tv_usec % 1000);
  tVar2.tv_sec = uVar1 / 1000;
  tVar2.tv_nsec = (uVar1 % 1000) * 1000000;
  return tVar2;
}

Assistant:

struct timespec convert_reltime_to_abstime(unsigned int ms) {
    struct timespec ts;
    struct timeval tp;
    uint64_t wakeup;

    memset(&ts, 0, sizeof(ts));

    /*
     * Unfortunately pthread_cond_timedwait doesn't support relative sleeps
     * so we need to convert back to an absolute time.
     */
    gettimeofday(&tp, NULL);
    wakeup = ((uint64_t)(tp.tv_sec) * 1000) + (tp.tv_usec / 1000) + ms;
    /* Round up for sub ms */
    if ((tp.tv_usec % 1000) > 499) {
        ++wakeup;
    }

    ts.tv_sec = wakeup / 1000;
    wakeup %= 1000;
    ts.tv_nsec = wakeup * 1000000;
    return ts;
}